

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O3

void __thiscall
asio::detail::scoped_ptr<asio::io_context>::~scoped_ptr(scoped_ptr<asio::io_context> *this)

{
  io_context *piVar1;
  _func_int ***ppp_Var2;
  service *psVar3;
  service_registry *psVar4;
  
  piVar1 = this->p_;
  if (piVar1 == (io_context *)0x0) goto LAB_00141718;
  psVar4 = (piVar1->super_execution_context).service_registry_;
  psVar3 = psVar4->first_service_;
  if (psVar3 == (service *)0x0) {
LAB_00141707:
    pthread_mutex_destroy((pthread_mutex_t *)&psVar4->mutex_);
  }
  else {
    do {
      (*psVar3->_vptr_service[2])(psVar3);
      psVar3 = psVar3->next_;
    } while (psVar3 != (service *)0x0);
    psVar4 = (piVar1->super_execution_context).service_registry_;
    psVar3 = psVar4->first_service_;
    if (psVar3 == (service *)0x0) goto LAB_00141707;
    do {
      ppp_Var2 = &psVar3->_vptr_service;
      psVar3 = psVar3->next_;
      (*(*ppp_Var2)[1])();
      psVar4->first_service_ = psVar3;
    } while (psVar3 != (service *)0x0);
    psVar4 = (piVar1->super_execution_context).service_registry_;
    if (psVar4 != (service_registry *)0x0) goto LAB_00141707;
    psVar4 = (service_registry *)0x0;
  }
  operator_delete(psVar4);
LAB_00141718:
  operator_delete(piVar1);
  return;
}

Assistant:

~scoped_ptr()
  {
    delete p_;
  }